

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O2

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  float fVar11;
  
  uVar8 = bottom_top_blob->h * bottom_top_blob->w;
  fVar1 = this->lambda;
  fVar2 = this->alpha;
  pvVar6 = bottom_top_blob->data;
  sVar3 = bottom_top_blob->cstep;
  sVar4 = bottom_top_blob->elemsize;
  uVar5 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar5;
  }
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar5;
  }
  for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      fVar11 = *(float *)((long)pvVar6 + uVar10 * 4);
      if (0.0 <= fVar11) {
        fVar11 = fVar11 * this->lambda;
      }
      else {
        fVar11 = expf(fVar11);
        fVar11 = (fVar11 + -1.0) * fVar1 * fVar2;
      }
      *(float *)((long)pvVar6 + uVar10 * 4) = fVar11;
    }
    pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>((exp(ptr[i]) - 1.f) * alphaxlambda);
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}